

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O0

void prf_vertex_palette_entry_f(prf_node_t *node,prf_state_t *state)

{
  long *in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_vertex_palette_info.opcode) {
    in_RSI[3] = (long)in_RDI;
    *(ushort **)(*in_RSI + 0x10) = in_RDI;
  }
  else {
    prf_error(9,"tried vertex palette entry state method for node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_vertex_palette_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    assert( (state->vertex_palette == NULL) ||
            (state->vertex_palette == node) );

    if ( node->opcode != prf_vertex_palette_info.opcode ) {
        prf_error( 9,
            "tried vertex palette entry state method for node of type %d.",
            node->opcode );
        return;
    }

    state->vertex_palette = node;
    state->model->vertex_palette = node;
}